

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O2

void resp0_pipe_fini(void *arg)

{
  nni_aio *aio;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x1f8);
  m = nni_aio_get_msg(aio);
  if (m != (nni_msg *)0x0) {
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_msg_free(m);
  }
  nni_aio_fini((nni_aio *)((long)arg + 0x30));
  nni_aio_fini(aio);
  return;
}

Assistant:

static void
resp0_pipe_fini(void *arg)
{
	resp0_pipe *p = arg;
	nng_msg    *msg;

	if ((msg = nni_aio_get_msg(&p->aio_recv)) != NULL) {
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_msg_free(msg);
	}
	nni_aio_fini(&p->aio_send);
	nni_aio_fini(&p->aio_recv);
}